

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O3

void __thiscall
wasm::OptimizationOptions::OptimizationOptions
          (OptimizationOptions *this,string *command,string *description)

{
  string *psVar1;
  long *plVar2;
  undefined8 uVar3;
  long *plVar4;
  __node_base *p_Var5;
  _Base_ptr p_Var6;
  OptimizationOptions *local_ee8;
  undefined8 local_ee0;
  code *local_ed8;
  code *local_ed0;
  OptimizationOptions *local_ec8;
  undefined8 local_ec0;
  code *local_eb8;
  code *local_eb0;
  OptimizationOptions *local_ea8;
  undefined8 local_ea0;
  code *local_e98;
  code *local_e90;
  OptimizationOptions *local_e88;
  undefined8 local_e80;
  code *local_e78;
  code *local_e70;
  OptimizationOptions *local_e68;
  undefined8 local_e60;
  code *local_e58;
  code *local_e50;
  OptimizationOptions *local_e48;
  undefined8 local_e40;
  code *local_e38;
  code *local_e30;
  OptimizationOptions *local_e28;
  undefined8 local_e20;
  code *local_e18;
  code *local_e10;
  OptimizationOptions *local_e08;
  undefined8 local_e00;
  code *local_df8;
  code *local_df0;
  OptimizationOptions *local_de8;
  undefined8 local_de0;
  code *local_dd8;
  code *local_dd0;
  OptimizationOptions *local_dc8;
  undefined8 local_dc0;
  code *local_db8;
  code *local_db0;
  OptimizationOptions *local_da8;
  undefined8 local_da0;
  code *local_d98;
  code *local_d90;
  OptimizationOptions *local_d88;
  undefined8 local_d80;
  code *local_d78;
  code *local_d70;
  OptimizationOptions *local_d68;
  undefined8 local_d60;
  code *local_d58;
  code *local_d50;
  OptimizationOptions *local_d48;
  undefined8 local_d40;
  code *local_d38;
  code *local_d30;
  OptimizationOptions *local_d28;
  undefined8 local_d20;
  code *local_d18;
  code *local_d10;
  OptimizationOptions *local_d08;
  undefined8 local_d00;
  code *local_cf8;
  code *local_cf0;
  OptimizationOptions *local_ce8;
  undefined8 local_ce0;
  code *local_cd8;
  code *local_cd0;
  OptimizationOptions *local_cc8;
  undefined8 local_cc0;
  code *local_cb8;
  code *local_cb0;
  OptimizationOptions *local_ca8;
  undefined8 local_ca0;
  code *local_c98;
  code *local_c90;
  OptimizationOptions *local_c88;
  undefined8 local_c80;
  code *local_c78;
  code *local_c70;
  OptimizationOptions *local_c68;
  undefined8 local_c60;
  code *local_c58;
  code *local_c50;
  long *local_c48 [2];
  long local_c38 [2];
  long *local_c28 [2];
  long local_c18 [2];
  long *local_c08 [2];
  long local_bf8 [2];
  long *local_be8 [2];
  long local_bd8 [2];
  _Base_ptr local_bc8;
  long *local_bc0 [2];
  long local_bb0 [2];
  long *local_ba0 [2];
  long local_b90 [2];
  long *local_b80 [2];
  long local_b70 [2];
  long *local_b60 [2];
  long local_b50 [2];
  long *local_b40 [2];
  long local_b30 [2];
  long *local_b20 [2];
  long local_b10 [2];
  long *local_b00 [2];
  long local_af0 [2];
  long *local_ae0 [2];
  long local_ad0 [2];
  long *local_ac0 [2];
  long local_ab0 [2];
  long *local_aa0 [2];
  long local_a90 [2];
  long *local_a80 [2];
  long local_a70 [2];
  long *local_a60 [2];
  long local_a50 [2];
  long *local_a40 [2];
  long local_a30 [2];
  long *local_a20 [2];
  long local_a10 [2];
  long *local_a00 [2];
  long local_9f0 [2];
  long *local_9e0 [2];
  long local_9d0 [2];
  long *local_9c0 [2];
  long local_9b0 [2];
  long *local_9a0 [2];
  long local_990 [2];
  long *local_980 [2];
  long local_970 [2];
  long *local_960 [2];
  long local_950 [2];
  long *local_940 [2];
  long local_930 [2];
  long *local_920 [2];
  long local_910 [2];
  long *local_900 [2];
  long local_8f0 [2];
  long *local_8e0 [2];
  long local_8d0 [2];
  long *local_8c0 [2];
  long local_8b0 [2];
  long *local_8a0 [2];
  long local_890 [2];
  long *local_880 [2];
  long local_870 [2];
  long *local_860 [2];
  long local_850 [2];
  long *local_840 [2];
  long local_830 [2];
  long *local_820 [2];
  long local_810 [2];
  long *local_800 [2];
  long local_7f0 [2];
  long *local_7e0 [2];
  long local_7d0 [2];
  long *local_7c0 [2];
  long local_7b0 [2];
  long *local_7a0 [2];
  long local_790 [2];
  long *local_780 [2];
  long local_770 [2];
  long *local_760 [2];
  long local_750 [2];
  long *local_740 [2];
  long local_730 [2];
  long *local_720 [2];
  long local_710 [2];
  long *local_700 [2];
  long local_6f0 [2];
  size_type *local_6e0;
  string __str;
  long local_6b0 [2];
  long *local_6a0 [2];
  long local_690 [2];
  long *local_680 [2];
  long local_670 [2];
  size_type *local_660;
  string __str_1;
  long local_630 [2];
  long *local_620 [2];
  long local_610 [2];
  long *local_600 [2];
  long local_5f0 [2];
  long *local_5e0 [2];
  long local_5d0 [2];
  long *local_5c0 [2];
  long local_5b0 [2];
  long *local_5a0 [2];
  long local_590 [2];
  long *local_580 [2];
  long local_570 [2];
  long *local_560 [2];
  long local_550 [2];
  long *local_540 [2];
  long local_530 [2];
  long *local_520 [2];
  long local_510 [2];
  long *local_500 [2];
  long local_4f0 [2];
  size_type *local_4e0;
  string __str_2;
  long local_4b0 [2];
  long *local_4a0 [2];
  long local_490 [2];
  long *local_480 [2];
  long local_470 [2];
  long *local_460 [2];
  long local_450 [2];
  long *local_440 [2];
  long local_430 [2];
  long *local_420 [2];
  long local_410 [2];
  long *local_400 [2];
  long local_3f0 [2];
  long *local_3e0 [2];
  long local_3d0 [2];
  long *local_3c0 [2];
  long local_3b0 [2];
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380 [2];
  long local_370 [2];
  long *local_360 [2];
  long local_350 [2];
  long *local_340 [2];
  long local_330 [2];
  long *local_320 [2];
  long local_310 [2];
  long *local_300 [2];
  long local_2f0 [2];
  long *local_2e0 [2];
  long local_2d0 [2];
  long *local_2c0 [2];
  long local_2b0 [2];
  long *local_2a0 [2];
  long local_290 [2];
  long *local_280 [2];
  long local_270 [2];
  long *local_260 [2];
  long local_250 [2];
  long *local_240 [2];
  long local_230 [2];
  long *local_220 [2];
  long local_210 [2];
  long *local_200 [2];
  long local_1f0 [2];
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  long *local_1c0;
  ulong local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  undefined4 uStack_188;
  undefined4 uStack_184;
  long *local_180;
  long local_178;
  long local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  long *local_160;
  long local_158;
  long local_150;
  undefined4 uStack_148;
  undefined4 uStack_144;
  OptimizationOptions *local_140;
  undefined8 local_138;
  code *local_130;
  code *local_128;
  undefined1 local_120 [32];
  pointer *local_100 [2];
  pointer local_f0 [2];
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  undefined1 local_d0 [24];
  _Any_data local_b8;
  _Base_ptr local_a8 [2];
  pointer local_98 [2];
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  __node_base local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  ToolOptions::ToolOptions(&this->super_ToolOptions,command,description);
  (this->passes).
  super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->passes).
  super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->passes).
  super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = (undefined1  [8])local_d0;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"");
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-O","");
  local_b8._M_unused._M_object = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"execute default optimization passes (equivalent to -Os)","");
  local_98[0] = (pointer)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Optimization options","");
  local_138 = 0;
  local_140 = (OptimizationOptions *)local_38;
  local_128 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:77:9)>
              ::_M_invoke;
  local_130 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:77:9)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     ((string *)local_38,(string *)local_e0,(string *)local_58._M_local_buf,
                      (string *)local_b8._M_pod_data,(Arguments)local_98,(function *)0x0,
                      SUB81(&local_140,0));
  local_78._M_allocated_capacity = (size_type)(local_88 + 0x20);
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_88 + 0x10),"");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"-O0","");
  local_120._0_8_ = local_120 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_120,"execute no optimization passes","");
  local_bc0[0] = local_bb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bc0,"Optimization options","");
  local_ee0 = 0;
  local_ee8 = (OptimizationOptions *)local_38;
  local_ed0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:90:12)>
              ::_M_invoke;
  local_ed8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:90:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)(local_88 + 0x10),(string *)local_100,(string *)local_120,
                      (Arguments)local_bc0,(function *)0x0,SUB81(&local_ee8,0));
  local_ba0[0] = local_b90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ba0,"");
  local_b80[0] = local_b70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b80,"-O1","");
  local_b60[0] = local_b50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b60,
             "execute -O1 optimization passes (quick&useful opts, useful for iteration builds)","");
  local_b40[0] = local_b30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b40,"Optimization options","");
  local_ec0 = 0;
  local_ec8 = (OptimizationOptions *)local_38;
  local_eb0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:100:12)>
              ::_M_invoke;
  local_eb8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:100:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_ba0,(string *)local_b80,(string *)local_b60,
                      (Arguments)local_b40,(function *)0x0,SUB81(&local_ec8,0));
  local_b20[0] = local_b10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b20,"");
  local_b00[0] = local_af0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b00,"-O2","");
  local_ae0[0] = local_ad0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ae0,
             "execute -O2 optimization passes (most opts, generally gets most perf)","");
  local_ac0[0] = local_ab0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac0,"Optimization options","");
  local_ea0 = 0;
  local_ea8 = (OptimizationOptions *)local_38;
  local_e90 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:111:9)>
              ::_M_invoke;
  local_e98 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:111:9)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_b20,(string *)local_b00,(string *)local_ae0,
                      (Arguments)local_ac0,(function *)0x0,SUB81(&local_ea8,0));
  local_aa0[0] = local_a90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_aa0,"");
  local_a80[0] = local_a70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a80,"-O3","");
  local_a60[0] = local_a50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a60,
             "execute -O3 optimization passes (spends potentially a lot of time optimizing)","");
  local_a40[0] = local_a30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a40,"Optimization options","");
  local_e80 = 0;
  local_e88 = (OptimizationOptions *)local_38;
  local_e70 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:122:12)>
              ::_M_invoke;
  local_e78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:122:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_aa0,(string *)local_a80,(string *)local_a60,
                      (Arguments)local_a40,(function *)0x0,SUB81(&local_e88,0));
  local_a20[0] = local_a10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a20,"");
  local_a00[0] = local_9f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a00,"-O4","");
  local_9e0[0] = local_9d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9e0,
             "execute -O4 optimization passes (also flatten the IR, which can take a lot more time and memory, but is useful on more nested / complex / less-optimized input)"
             ,"");
  local_9c0[0] = local_9b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9c0,"Optimization options","");
  local_e60 = 0;
  local_e68 = (OptimizationOptions *)local_38;
  local_e50 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:134:12)>
              ::_M_invoke;
  local_e58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:134:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_a20,(string *)local_a00,(string *)local_9e0,
                      (Arguments)local_9c0,(function *)0x0,SUB81(&local_e68,0));
  local_9a0[0] = local_990;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"");
  local_980[0] = local_970;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_980,"-Os","");
  local_960[0] = local_950;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_960,"execute default optimization passes, focusing on code size","");
  local_940[0] = local_930;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_940,"Optimization options","");
  local_e40 = 0;
  local_e48 = (OptimizationOptions *)local_38;
  local_e30 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:144:12)>
              ::_M_invoke;
  local_e38 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:144:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_9a0,(string *)local_980,(string *)local_960,
                      (Arguments)local_940,(function *)0x0,SUB81(&local_e48,0));
  local_920[0] = local_910;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"");
  local_900[0] = local_8f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_900,"-Oz","");
  local_8e0[0] = local_8d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8e0,"execute default optimization passes, super-focusing on code size",
             "");
  local_8c0[0] = local_8b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"Optimization options","");
  local_e20 = 0;
  local_e28 = (OptimizationOptions *)local_38;
  local_e10 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:154:12)>
              ::_M_invoke;
  local_e18 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:154:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_920,(string *)local_900,(string *)local_8e0,
                      (Arguments)local_8c0,(function *)0x0,SUB81(&local_e28,0));
  local_8a0[0] = local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8a0,"--optimize-level","");
  local_880[0] = local_870;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_880,"-ol","");
  local_860[0] = local_850;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_860,"How much to focus on optimizing code","");
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"Optimization options","");
  local_e00 = 0;
  local_e08 = (OptimizationOptions *)local_38;
  local_df0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:164:12)>
              ::_M_invoke;
  local_df8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:164:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_8a0,(string *)local_880,(string *)local_860,
                      (Arguments)local_840,(function *)0x1,SUB81(&local_e08,0));
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"--shrink-level","");
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"-s","");
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e0,"How much to focus on shrinking code size","");
  local_7c0[0] = local_7b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c0,"Optimization options","");
  local_de0 = 0;
  local_de8 = (OptimizationOptions *)local_38;
  local_dd0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:172:12)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:172:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_820,(string *)local_800,(string *)local_7e0,
                      (Arguments)local_7c0,(function *)0x1,SUB81(&local_de8,0));
  local_7a0[0] = local_790;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7a0,"--debuginfo","");
  local_780[0] = local_770;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_780,"-g","");
  local_760[0] = local_750;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_760,"Emit names section in wasm binary (or full debuginfo in wast)","")
  ;
  local_740[0] = local_730;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"Optimization options","");
  local_dc0 = 0;
  local_dc8 = (OptimizationOptions *)local_38;
  local_db0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:180:12)>
              ::_M_invoke;
  local_db8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:180:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_7a0,(string *)local_780,(string *)local_760,
                      (Arguments)local_740,(function *)0x0,SUB81(&local_dc8,0));
  local_720[0] = local_710;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_720,"--always-inline-max-function-size","");
  local_700[0] = local_6f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"-aimfs","");
  local_6e0 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_6e0,'\x01');
  *(undefined1 *)local_6e0 = 0x32;
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_6e0,0,(char *)0x0,0x18ad6f);
  local_1e0 = &local_1d0;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_1d0 = *plVar4;
    lStack_1c8 = plVar2[3];
  }
  else {
    local_1d0 = *plVar4;
    local_1e0 = (long *)*plVar2;
  }
  local_1d8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  local_1a0 = &local_190;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_190 = *plVar4;
    uStack_188 = (undefined4)plVar2[3];
    uStack_184 = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_190 = *plVar4;
    local_1a0 = (long *)*plVar2;
  }
  local_198 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __str.field_2._8_8_ = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str.field_2 + 8),"Optimization options","");
  local_da0 = 0;
  local_da8 = (OptimizationOptions *)local_38;
  local_d90 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:191:12)>
              ::_M_invoke;
  local_d98 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:191:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_720,(string *)local_700,(string *)&local_1a0,
                      (int)&__str + 0x18,(function *)0x1,SUB81(&local_da8,0));
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6a0,"--flexible-inline-max-function-size","");
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"-fimfs","");
  local_660 = &__str_1._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_660,'\x02');
  *(undefined2 *)local_660 = 0x3032;
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_660,0,(char *)0x0,0x18adfb);
  local_180 = &local_170;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_170 = *plVar4;
    uStack_168 = (undefined4)plVar2[3];
    uStack_164 = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_170 = *plVar4;
    local_180 = (long *)*plVar2;
  }
  local_178 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __str_1.field_2._8_8_ = local_630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str_1.field_2 + 8),"Optimization options","");
  local_d80 = 0;
  local_d88 = (OptimizationOptions *)local_38;
  local_d70 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:203:12)>
              ::_M_invoke;
  local_d78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:203:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_6a0,(string *)local_680,(string *)&local_180,
                      (int)&__str_1 + 0x18,(function *)0x1,SUB81(&local_d88,0));
  local_620[0] = local_610;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_620,"--one-caller-inline-max-function-size","");
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"-ocimfs","");
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5e0,
             "Max size of functions that are inlined when there is only one caller (default -1, which means all such functions are inlined)"
             ,"");
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"Optimization options","");
  local_d60 = 0;
  local_d68 = (OptimizationOptions *)local_38;
  local_d50 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:213:12)>
              ::_M_invoke;
  local_d58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:213:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_620,(string *)local_600,(string *)local_5e0,
                      (Arguments)local_5c0,(function *)0x1,SUB81(&local_d68,0));
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5a0,"--inline-functions-with-loops","");
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"-ifwl","");
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_560,"Allow inlining functions with loops","");
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"Optimization options","");
  local_d40 = 0;
  local_d48 = (OptimizationOptions *)local_38;
  local_d30 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:225:12)>
              ::_M_invoke;
  local_d38 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:225:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_5a0,(string *)local_580,(string *)local_560,
                      (Arguments)local_540,(function *)0x0,SUB81(&local_d48,0));
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"--partial-inlining-ifs","");
  local_500[0] = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"-pii","");
  local_4e0 = &__str_2._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_4e0,'\x01');
  *(undefined1 *)local_4e0 = 0x30;
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,0x18af98);
  local_1c0 = &local_1b0;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_1b0 = *plVar4;
    lStack_1a8 = plVar2[3];
  }
  else {
    local_1b0 = *plVar4;
    local_1c0 = (long *)*plVar2;
  }
  local_1b8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_1c0,local_1b8,0,'\x01');
  local_160 = &local_150;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_150 = *plVar4;
    uStack_148 = (undefined4)plVar2[3];
    uStack_144 = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_150 = *plVar4;
    local_160 = (long *)*plVar2;
  }
  local_158 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __str_2.field_2._8_8_ = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str_2.field_2 + 8),"Optimization options","");
  local_d20 = 0;
  local_d28 = (OptimizationOptions *)local_38;
  local_d10 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:235:12)>
              ::_M_invoke;
  local_d18 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:235:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_520,(string *)local_500,(string *)&local_160,
                      (int)&__str_2 + 0x18,(function *)0x1,SUB81(&local_d28,0));
  local_4a0[0] = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"--ignore-implicit-traps","");
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"-iit","");
  local_460[0] = local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_460,
             "Optimize under the helpful assumption that no surprising traps occur (from load, div/mod, etc.)"
             ,"");
  local_440[0] = local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"Optimization options","");
  local_d00 = 0;
  local_d08 = (OptimizationOptions *)local_38;
  local_cf0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:245:12)>
              ::_M_invoke;
  local_cf8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:245:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_4a0,(string *)local_480,(string *)local_460,
                      (Arguments)local_440,(function *)0x0,SUB81(&local_d08,0));
  local_420[0] = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"--traps-never-happen","");
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"-tnh","");
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e0,
             "Optimize under the helpful assumption that no trap is reached at runtime (from load, div/mod, etc.)"
             ,"");
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"Optimization options","");
  local_ce0 = 0;
  local_ce8 = (OptimizationOptions *)local_38;
  local_cd0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:254:12)>
              ::_M_invoke;
  local_cd8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:254:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_420,(string *)local_400,(string *)local_3e0,
                      (Arguments)local_3c0,(function *)0x0,SUB81(&local_ce8,0));
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"--low-memory-unused","");
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"-lmu","");
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_360,
             "Optimize under the helpful assumption that the low 1K of memory is not used by the application"
             ,"");
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"Optimization options","");
  local_cc0 = 0;
  local_cc8 = (OptimizationOptions *)local_38;
  local_cb0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:263:12)>
              ::_M_invoke;
  local_cb8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:263:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_3a0,(string *)local_380,(string *)local_360,
                      (Arguments)local_340,(function *)0x0,SUB81(&local_cc8,0));
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"--fast-math","");
  local_300[0] = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"-ffm","");
  local_2e0[0] = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e0,
             "Optimize floats without handling corner cases of NaNs and rounding","");
  local_2c0[0] = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"Optimization options","");
  local_ca0 = 0;
  local_ca8 = (OptimizationOptions *)local_38;
  local_c90 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:272:9)>
              ::_M_invoke;
  local_c98 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:272:9)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_320,(string *)local_300,(string *)local_2e0,
                      (Arguments)local_2c0,(function *)0x0,SUB81(&local_ca8,0));
  local_c48[0] = local_c38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c48,"--zero-filled-memory","");
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"-uim","");
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,"Assume that an imported memory will be zero-initialized","");
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"Optimization options","");
  local_c80 = 0;
  local_c88 = (OptimizationOptions *)local_38;
  local_c70 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:278:12)>
              ::_M_invoke;
  local_c78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:278:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,(string *)local_c48,(string *)local_2a0,(string *)local_280,
                      (Arguments)local_260,(function *)0x0,SUB81(&local_c88,0));
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"--skip-pass","");
  local_c28[0] = local_c18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c28,"-sp","");
  local_c08[0] = local_bf8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c08,"Skip a pass (do not run it)","");
  local_be8[0] = local_bd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_be8,"Optimization options","");
  local_c60 = 0;
  local_c68 = (OptimizationOptions *)local_38;
  local_c50 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:286:12)>
              ::_M_invoke;
  local_c58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:286:12)>
              ::_M_manager;
  ::wasm::Options::add
            (psVar1,(string *)local_240,(string *)local_c28,(string *)local_c08,(Arguments)local_be8
             ,(function *)0x1,SUB81(&local_c68,0));
  if (local_c58 != (code *)0x0) {
    (*local_c58)(&local_c68,&local_c68,3);
  }
  if (local_be8[0] != local_bd8) {
    operator_delete(local_be8[0],local_bd8[0] + 1);
  }
  if (local_c08[0] != local_bf8) {
    operator_delete(local_c08[0],local_bf8[0] + 1);
  }
  if (local_c28[0] != local_c18) {
    operator_delete(local_c28[0],local_c18[0] + 1);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  if (local_c78 != (code *)0x0) {
    (*local_c78)(&local_c88,&local_c88,3);
  }
  if (local_260[0] != local_250) {
    operator_delete(local_260[0],local_250[0] + 1);
  }
  if (local_280[0] != local_270) {
    operator_delete(local_280[0],local_270[0] + 1);
  }
  if (local_2a0[0] != local_290) {
    operator_delete(local_2a0[0],local_290[0] + 1);
  }
  if (local_c48[0] != local_c38) {
    operator_delete(local_c48[0],local_c38[0] + 1);
  }
  if (local_c98 != (code *)0x0) {
    (*local_c98)(&local_ca8,&local_ca8,3);
  }
  if (local_2c0[0] != local_2b0) {
    operator_delete(local_2c0[0],local_2b0[0] + 1);
  }
  if (local_2e0[0] != local_2d0) {
    operator_delete(local_2e0[0],local_2d0[0] + 1);
  }
  if (local_300[0] != local_2f0) {
    operator_delete(local_300[0],local_2f0[0] + 1);
  }
  if (local_320[0] != local_310) {
    operator_delete(local_320[0],local_310[0] + 1);
  }
  if (local_cb8 != (code *)0x0) {
    (*local_cb8)(&local_cc8,&local_cc8,3);
  }
  if (local_340[0] != local_330) {
    operator_delete(local_340[0],local_330[0] + 1);
  }
  if (local_360[0] != local_350) {
    operator_delete(local_360[0],local_350[0] + 1);
  }
  if (local_380[0] != local_370) {
    operator_delete(local_380[0],local_370[0] + 1);
  }
  if (local_3a0[0] != local_390) {
    operator_delete(local_3a0[0],local_390[0] + 1);
  }
  if (local_cd8 != (code *)0x0) {
    (*local_cd8)(&local_ce8,&local_ce8,3);
  }
  if (local_3c0[0] != local_3b0) {
    operator_delete(local_3c0[0],local_3b0[0] + 1);
  }
  if (local_3e0[0] != local_3d0) {
    operator_delete(local_3e0[0],local_3d0[0] + 1);
  }
  if (local_400[0] != local_3f0) {
    operator_delete(local_400[0],local_3f0[0] + 1);
  }
  if (local_420[0] != local_410) {
    operator_delete(local_420[0],local_410[0] + 1);
  }
  if (local_cf8 != (code *)0x0) {
    (*local_cf8)(&local_d08,&local_d08,3);
  }
  if (local_440[0] != local_430) {
    operator_delete(local_440[0],local_430[0] + 1);
  }
  if (local_460[0] != local_450) {
    operator_delete(local_460[0],local_450[0] + 1);
  }
  if (local_480[0] != local_470) {
    operator_delete(local_480[0],local_470[0] + 1);
  }
  if (local_4a0[0] != local_490) {
    operator_delete(local_4a0[0],local_490[0] + 1);
  }
  if (local_d18 != (code *)0x0) {
    (*local_d18)(&local_d28,&local_d28,3);
  }
  if ((long *)__str_2.field_2._8_8_ != local_4b0) {
    operator_delete((void *)__str_2.field_2._8_8_,local_4b0[0] + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_4e0 != &__str_2._M_string_length) {
    operator_delete(local_4e0,__str_2._M_string_length + 1);
  }
  if (local_500[0] != local_4f0) {
    operator_delete(local_500[0],local_4f0[0] + 1);
  }
  if (local_520[0] != local_510) {
    operator_delete(local_520[0],local_510[0] + 1);
  }
  if (local_d38 != (code *)0x0) {
    (*local_d38)(&local_d48,&local_d48,3);
  }
  if (local_540[0] != local_530) {
    operator_delete(local_540[0],local_530[0] + 1);
  }
  if (local_560[0] != local_550) {
    operator_delete(local_560[0],local_550[0] + 1);
  }
  if (local_580[0] != local_570) {
    operator_delete(local_580[0],local_570[0] + 1);
  }
  if (local_5a0[0] != local_590) {
    operator_delete(local_5a0[0],local_590[0] + 1);
  }
  if (local_d58 != (code *)0x0) {
    (*local_d58)(&local_d68,&local_d68,3);
  }
  if (local_5c0[0] != local_5b0) {
    operator_delete(local_5c0[0],local_5b0[0] + 1);
  }
  if (local_5e0[0] != local_5d0) {
    operator_delete(local_5e0[0],local_5d0[0] + 1);
  }
  if (local_600[0] != local_5f0) {
    operator_delete(local_600[0],local_5f0[0] + 1);
  }
  if (local_620[0] != local_610) {
    operator_delete(local_620[0],local_610[0] + 1);
  }
  if (local_d78 != (code *)0x0) {
    (*local_d78)(&local_d88,&local_d88,3);
  }
  if ((long *)__str_1.field_2._8_8_ != local_630) {
    operator_delete((void *)__str_1.field_2._8_8_,local_630[0] + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if (local_660 != &__str_1._M_string_length) {
    operator_delete(local_660,__str_1._M_string_length + 1);
  }
  if (local_680[0] != local_670) {
    operator_delete(local_680[0],local_670[0] + 1);
  }
  if (local_6a0[0] != local_690) {
    operator_delete(local_6a0[0],local_690[0] + 1);
  }
  if (local_d98 != (code *)0x0) {
    (*local_d98)(&local_da8,&local_da8,3);
  }
  if ((long *)__str.field_2._8_8_ != local_6b0) {
    operator_delete((void *)__str.field_2._8_8_,local_6b0[0] + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if (local_6e0 != &__str._M_string_length) {
    operator_delete(local_6e0,__str._M_string_length + 1);
  }
  if (local_700[0] != local_6f0) {
    operator_delete(local_700[0],local_6f0[0] + 1);
  }
  if (local_720[0] != local_710) {
    operator_delete(local_720[0],local_710[0] + 1);
  }
  if (local_db8 != (code *)0x0) {
    (*local_db8)(&local_dc8,&local_dc8,3);
  }
  if (local_740[0] != local_730) {
    operator_delete(local_740[0],local_730[0] + 1);
  }
  if (local_760[0] != local_750) {
    operator_delete(local_760[0],local_750[0] + 1);
  }
  if (local_780[0] != local_770) {
    operator_delete(local_780[0],local_770[0] + 1);
  }
  if (local_7a0[0] != local_790) {
    operator_delete(local_7a0[0],local_790[0] + 1);
  }
  if (local_dd8 != (code *)0x0) {
    (*local_dd8)(&local_de8,&local_de8,3);
  }
  if (local_7c0[0] != local_7b0) {
    operator_delete(local_7c0[0],local_7b0[0] + 1);
  }
  if (local_7e0[0] != local_7d0) {
    operator_delete(local_7e0[0],local_7d0[0] + 1);
  }
  if (local_800[0] != local_7f0) {
    operator_delete(local_800[0],local_7f0[0] + 1);
  }
  if (local_820[0] != local_810) {
    operator_delete(local_820[0],local_810[0] + 1);
  }
  if (local_df8 != (code *)0x0) {
    (*local_df8)(&local_e08,&local_e08,3);
  }
  if (local_840[0] != local_830) {
    operator_delete(local_840[0],local_830[0] + 1);
  }
  if (local_860[0] != local_850) {
    operator_delete(local_860[0],local_850[0] + 1);
  }
  if (local_880[0] != local_870) {
    operator_delete(local_880[0],local_870[0] + 1);
  }
  if (local_8a0[0] != local_890) {
    operator_delete(local_8a0[0],local_890[0] + 1);
  }
  if (local_e18 != (code *)0x0) {
    (*local_e18)(&local_e28,&local_e28,3);
  }
  if (local_8c0[0] != local_8b0) {
    operator_delete(local_8c0[0],local_8b0[0] + 1);
  }
  if (local_8e0[0] != local_8d0) {
    operator_delete(local_8e0[0],local_8d0[0] + 1);
  }
  if (local_900[0] != local_8f0) {
    operator_delete(local_900[0],local_8f0[0] + 1);
  }
  if (local_920[0] != local_910) {
    operator_delete(local_920[0],local_910[0] + 1);
  }
  if (local_e38 != (code *)0x0) {
    (*local_e38)(&local_e48,&local_e48,3);
  }
  if (local_940[0] != local_930) {
    operator_delete(local_940[0],local_930[0] + 1);
  }
  if (local_960[0] != local_950) {
    operator_delete(local_960[0],local_950[0] + 1);
  }
  if (local_980[0] != local_970) {
    operator_delete(local_980[0],local_970[0] + 1);
  }
  if (local_9a0[0] != local_990) {
    operator_delete(local_9a0[0],local_990[0] + 1);
  }
  if (local_e58 != (code *)0x0) {
    (*local_e58)(&local_e68,&local_e68,3);
  }
  if (local_9c0[0] != local_9b0) {
    operator_delete(local_9c0[0],local_9b0[0] + 1);
  }
  if (local_9e0[0] != local_9d0) {
    operator_delete(local_9e0[0],local_9d0[0] + 1);
  }
  if (local_a00[0] != local_9f0) {
    operator_delete(local_a00[0],local_9f0[0] + 1);
  }
  if (local_a20[0] != local_a10) {
    operator_delete(local_a20[0],local_a10[0] + 1);
  }
  if (local_e78 != (code *)0x0) {
    (*local_e78)(&local_e88,&local_e88,3);
  }
  if (local_a40[0] != local_a30) {
    operator_delete(local_a40[0],local_a30[0] + 1);
  }
  if (local_a60[0] != local_a50) {
    operator_delete(local_a60[0],local_a50[0] + 1);
  }
  if (local_a80[0] != local_a70) {
    operator_delete(local_a80[0],local_a70[0] + 1);
  }
  if (local_aa0[0] != local_a90) {
    operator_delete(local_aa0[0],local_a90[0] + 1);
  }
  if (local_e98 != (code *)0x0) {
    (*local_e98)(&local_ea8,&local_ea8,3);
  }
  if (local_ac0[0] != local_ab0) {
    operator_delete(local_ac0[0],local_ab0[0] + 1);
  }
  if (local_ae0[0] != local_ad0) {
    operator_delete(local_ae0[0],local_ad0[0] + 1);
  }
  if (local_b00[0] != local_af0) {
    operator_delete(local_b00[0],local_af0[0] + 1);
  }
  if (local_b20[0] != local_b10) {
    operator_delete(local_b20[0],local_b10[0] + 1);
  }
  if (local_eb8 != (code *)0x0) {
    (*local_eb8)(&local_ec8,&local_ec8,3);
  }
  if (local_b40[0] != local_b30) {
    operator_delete(local_b40[0],local_b30[0] + 1);
  }
  if (local_b60[0] != local_b50) {
    operator_delete(local_b60[0],local_b50[0] + 1);
  }
  if (local_b80[0] != local_b70) {
    operator_delete(local_b80[0],local_b70[0] + 1);
  }
  if (local_ba0[0] != local_b90) {
    operator_delete(local_ba0[0],local_b90[0] + 1);
  }
  if (local_ed8 != (code *)0x0) {
    (*local_ed8)(&local_ee8,&local_ee8,3);
  }
  if (local_bc0[0] != local_bb0) {
    operator_delete(local_bc0[0],local_bb0[0] + 1);
  }
  if ((_Base_ptr)local_120._0_8_ != (_Base_ptr)(local_120 + 0x10)) {
    operator_delete((void *)local_120._0_8_,(ulong)((long)(_Rb_tree_color *)local_120._16_8_ + 1));
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],(ulong)((long)&(local_f0[0]->longName)._M_dataplus._M_p + 1));
  }
  if ((undefined1 *)local_78._M_allocated_capacity != local_88 + 0x20) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  if (local_130 != (code *)0x0) {
    (*local_130)(&local_140,&local_140,3);
  }
  if (local_98[0] != (pointer)local_88) {
    operator_delete(local_98[0],(ulong)(local_88._0_8_ + 1));
  }
  if ((_Base_ptr)local_b8._M_unused._0_8_ != (_Base_ptr)local_a8) {
    operator_delete(local_b8._M_unused._M_object,(ulong)((long)&local_a8[0]->_M_color + 1));
  }
  if ((__node_base *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)((long)&(local_48._M_nxt)->_M_nxt + 1));
  }
  if (local_e0 != (undefined1  [8])local_d0) {
    operator_delete((void *)local_e0,local_d0._0_8_ + 1);
  }
  ::wasm::PassRegistry::get();
  ::wasm::PassRegistry::getRegisteredNames_abi_cxx11_();
  local_bc8 = (_Base_ptr)local_120._8_8_;
  if (local_120._0_8_ != local_120._8_8_) {
    p_Var6 = (_Base_ptr)local_120._0_8_;
    do {
      local_b8._M_unused._M_object = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"--","");
      plVar2 = (long *)std::__cxx11::string::_M_append(local_b8._M_pod_data,*(ulong *)p_Var6);
      local_58._M_allocated_capacity = (size_type)&local_48;
      p_Var5 = (__node_base *)(plVar2 + 2);
      if ((__node_base *)*plVar2 == p_Var5) {
        local_48._M_nxt = p_Var5->_M_nxt;
        uStack_40 = (undefined4)plVar2[3];
        uStack_3c = *(undefined4 *)((long)plVar2 + 0x1c);
      }
      else {
        local_48._M_nxt = p_Var5->_M_nxt;
        local_58._M_allocated_capacity = (size_type)(__node_base *)*plVar2;
      }
      local_58._8_8_ = plVar2[1];
      *plVar2 = (long)p_Var5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      local_98[0] = (pointer)local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
      uVar3 = ::wasm::PassRegistry::get();
      local_220[0] = local_210;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_220,*(ulong *)p_Var6,
                 (long)&p_Var6->_M_parent->_M_color + *(ulong *)p_Var6);
      ::wasm::PassRegistry::getPassDescription(&local_140,uVar3,(string *)local_220);
      local_78._M_allocated_capacity = (size_type)(local_88 + 0x20);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_88 + 0x10),"Optimization passes","");
      local_e0 = (undefined1  [8])local_38;
      local_d8._M_p = local_d0 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,*(ulong *)p_Var6,
                 (long)&p_Var6->_M_parent->_M_color + *(ulong *)p_Var6);
      std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
      function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_23_,void>
                ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)local_100,
                 (anon_class_40_2_fd512ddd *)local_e0);
      uVar3 = ::wasm::PassRegistry::get();
      local_200[0] = local_1f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_200,*(ulong *)p_Var6,
                 (long)&p_Var6->_M_parent->_M_color + *(ulong *)p_Var6);
      ::wasm::PassRegistry::isPassHidden(uVar3,(string *)local_200);
      ::wasm::Options::add
                ((string *)local_38,(string *)local_58._M_local_buf,(string *)local_98,
                 (string *)&local_140,(int)local_88 + 0x10,(function *)0x3,false);
      if (local_200[0] != local_1f0) {
        operator_delete(local_200[0],local_1f0[0] + 1);
      }
      if (local_f0[0] != (pointer)0x0) {
        (*(code *)local_f0[0])(local_100,local_100,3);
      }
      if (local_d8._M_p != local_d0 + 8) {
        operator_delete(local_d8._M_p,local_d0._8_8_ + 1);
      }
      if ((undefined1 *)local_78._M_allocated_capacity != local_88 + 0x20) {
        operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
      }
      if (local_140 != (OptimizationOptions *)&local_130) {
        operator_delete(local_140,(ulong)(local_130 + 1));
      }
      if (local_220[0] != local_210) {
        operator_delete(local_220[0],local_210[0] + 1);
      }
      if (local_98[0] != (pointer)local_88) {
        operator_delete(local_98[0],(ulong)(local_88._0_8_ + 1));
      }
      if ((__node_base *)local_58._M_allocated_capacity != &local_48) {
        operator_delete((void *)local_58._M_allocated_capacity,
                        (ulong)((long)&(local_48._M_nxt)->_M_nxt + 1));
      }
      if ((_Base_ptr)local_b8._M_unused._0_8_ != (_Base_ptr)local_a8) {
        operator_delete(local_b8._M_unused._M_object,(ulong)((long)&local_a8[0]->_M_color + 1));
      }
      p_Var6 = p_Var6 + 1;
    } while (p_Var6 != local_bc8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  return;
}

Assistant:

OptimizationOptions(const std::string& command,
                      const std::string& description)
    : ToolOptions(command, description) {
    (*this)
      .add(
        "",
        "-O",
        "execute default optimization passes (equivalent to -Os)",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.setDefaultOptimizationOptions();
          static_assert(
            PassOptions::DEFAULT_OPTIMIZE_LEVEL == OS_OPTIMIZE_LEVEL &&
              PassOptions::DEFAULT_SHRINK_LEVEL == OS_SHRINK_LEVEL,
            "Help text states that -O is equivalent to -Os but now it isn't.");
          addDefaultOptPasses();
        })
      .add("",
           "-O0",
           "execute no optimization passes",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 0;
             passOptions.shrinkLevel = 0;
           })
      .add("",
           "-O1",
           "execute -O1 optimization passes (quick&useful opts, useful for "
           "iteration builds)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 1;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add(
        "",
        "-O2",
        "execute -O2 optimization passes (most opts, generally gets most perf)",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.optimizeLevel = 2;
          passOptions.shrinkLevel = 0;
          addDefaultOptPasses();
        })
      .add("",
           "-O3",
           "execute -O3 optimization passes (spends potentially a lot of time "
           "optimizing)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 3;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add("",
           "-O4",
           "execute -O4 optimization passes (also flatten the IR, which can "
           "take a lot more time and memory, but is useful on more nested / "
           "complex / less-optimized input)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 4;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add("",
           "-Os",
           "execute default optimization passes, focusing on code size",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = OS_OPTIMIZE_LEVEL;
             passOptions.shrinkLevel = OS_SHRINK_LEVEL;
             addDefaultOptPasses();
           })
      .add("",
           "-Oz",
           "execute default optimization passes, super-focusing on code size",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 2;
             passOptions.shrinkLevel = 2;
             addDefaultOptPasses();
           })
      .add("--optimize-level",
           "-ol",
           "How much to focus on optimizing code",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.optimizeLevel = atoi(argument.c_str());
           })
      .add("--shrink-level",
           "-s",
           "How much to focus on shrinking code size",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.shrinkLevel = atoi(argument.c_str());
           })
      .add("--debuginfo",
           "-g",
           "Emit names section in wasm binary (or full debuginfo in wast)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             passOptions.debugInfo = true;
           })
      .add("--always-inline-max-function-size",
           "-aimfs",
           "Max size of functions that are always inlined (default " +
             std::to_string(InliningOptions().alwaysInlineMaxSize) +
             ", which "
             "is safe for use with -Os builds)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.alwaysInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--flexible-inline-max-function-size",
           "-fimfs",
           "Max size of functions that are inlined when lightweight (no loops "
           "or function calls) when optimizing aggressively for speed (-O3). "
           "Default: " +
             std::to_string(InliningOptions().flexibleInlineMaxSize),
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.flexibleInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--one-caller-inline-max-function-size",
           "-ocimfs",
           "Max size of functions that are inlined when there is only one "
           "caller (default -1, which means all such functions are inlined)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             static_assert(InliningOptions().oneCallerInlineMaxSize ==
                             Index(-1),
                           "the help text here is written to assume -1");
             passOptions.inlining.oneCallerInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--inline-functions-with-loops",
           "-ifwl",
           "Allow inlining functions with loops",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options* o, const std::string&) {
             passOptions.inlining.allowFunctionsWithLoops = true;
           })
      .add("--partial-inlining-ifs",
           "-pii",
           "Number of ifs allowed in partial inlining (zero means partial "
           "inlining is disabled) (default: " +
             std::to_string(InliningOptions().partialInliningIfs) + ')',
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.partialInliningIfs =
               static_cast<Index>(std::stoi(argument));
           })
      .add("--ignore-implicit-traps",
           "-iit",
           "Optimize under the helpful assumption that no surprising traps "
           "occur (from load, div/mod, etc.)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.ignoreImplicitTraps = true;
           })
      .add("--traps-never-happen",
           "-tnh",
           "Optimize under the helpful assumption that no trap is reached at "
           "runtime (from load, div/mod, etc.)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.trapsNeverHappen = true;
           })
      .add("--low-memory-unused",
           "-lmu",
           "Optimize under the helpful assumption that the low 1K of memory is "
           "not used by the application",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.lowMemoryUnused = true;
           })
      .add(
        "--fast-math",
        "-ffm",
        "Optimize floats without handling corner cases of NaNs and rounding",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) { passOptions.fastMath = true; })
      .add("--zero-filled-memory",
           "-uim",
           "Assume that an imported memory will be zero-initialized",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.zeroFilledMemory = true;
           })
      .add("--skip-pass",
           "-sp",
           "Skip a pass (do not run it)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options*, const std::string& pass) {
             passOptions.passesToSkip.insert(pass);
           });

    // add passes in registry
    for (const auto& p : PassRegistry::get()->getRegisteredNames()) {
      (*this).add(
        std::string("--") + p,
        "",
        PassRegistry::get()->getPassDescription(p),
        "Optimization passes",
        // Allow an optional parameter to a pass. If provided, it is
        // the same as if using --pass-arg, that is,
        //
        //   --foo=ARG
        //
        // is the same as
        //
        //   --foo --pass-arg=foo@ARG
        Options::Arguments::Optional,
        [this, p](Options*, const std::string& arg) {
          if (!arg.empty()) {
            if (passOptions.arguments.count(p)) {
              Fatal() << "Cannot pass multiple pass arguments to " << p;
            }
            passOptions.arguments[p] = arg;
          }
          passes.push_back(p);
        },
        PassRegistry::get()->isPassHidden(p));
    }
  }